

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderReturnTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int iVar2;
  TestNode *pTVar3;
  mapped_type *pmVar4;
  TestNode *pTVar5;
  ShaderEvalFunc p_Var6;
  ReturnTestUniformSetup *pRVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  TestNode *local_1a8;
  string local_1a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate tmpl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string description;
  string name;
  key_type local_50;
  
  pTVar3 = (TestNode *)operator_new(0xe0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_1a8 = (TestNode *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params,"single_return_vertex",(allocator<char> *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tmpl,"Single return statement in function",(allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,(allocator<char> *)&local_d0);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,(string *)&params,&tmpl.m_template,true,&local_1a0,
             evalReturnAlways,(UniformSetup *)0x0);
  pTVar5 = local_1a8;
  tcu::TestNode::addChild(local_1a8,pTVar3);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&tmpl);
  std::__cxx11::string::~string((string *)&params);
  pTVar3 = (TestNode *)operator_new(0xe0);
  pTVar1 = pTVar5->m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params,"single_return_fragment",(allocator<char> *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tmpl,"Single return statement in function",(allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,(allocator<char> *)&local_d0);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,(string *)&params,&tmpl.m_template,false,&local_1a0,
             evalReturnAlways,(UniformSetup *)0x0);
  uVar11 = 0;
  tcu::TestNode::addChild(local_1a8,pTVar3);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&tmpl);
  std::__cxx11::string::~string((string *)&params);
  do {
    if (uVar11 == 3) {
      pTVar3 = (TestNode *)operator_new(0xe0);
      pTVar1 = local_1a8->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,"double_return_vertex",(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpl,"Unconditional double return in function",
                 (allocator<char> *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
                 ,(allocator<char> *)&local_d0);
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar3,pTVar1,(string *)&params,&tmpl.m_template,true,
                 &local_1a0,evalReturnAlways,(UniformSetup *)0x0);
      pTVar5 = local_1a8;
      tcu::TestNode::addChild(local_1a8,pTVar3);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&tmpl);
      std::__cxx11::string::~string((string *)&params);
      pTVar3 = (TestNode *)operator_new(0xe0);
      pTVar1 = pTVar5->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,"double_return_fragment",(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpl,"Unconditional double return in function",
                 (allocator<char> *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
                 ,(allocator<char> *)&local_d0);
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar3,pTVar1,(string *)&params,&tmpl.m_template,false,
                 &local_1a0,evalReturnAlways,(UniformSetup *)0x0);
      pTVar5 = local_1a8;
      tcu::TestNode::addChild(local_1a8,pTVar3);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&tmpl);
      std::__cxx11::string::~string((string *)&params);
      pTVar3 = (TestNode *)operator_new(0xe0);
      pTVar1 = pTVar5->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,"last_statement_in_main_vertex",(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpl,"Return as a final statement in main()",
                 (allocator<char> *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
                 ,(allocator<char> *)&local_d0);
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar3,pTVar1,(string *)&params,&tmpl.m_template,true,
                 &local_1a0,evalReturnAlways,(UniformSetup *)0x0);
      pTVar5 = local_1a8;
      tcu::TestNode::addChild(local_1a8,pTVar3);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&tmpl);
      std::__cxx11::string::~string((string *)&params);
      pTVar3 = (TestNode *)operator_new(0xe0);
      pTVar1 = pTVar5->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,"last_statement_in_main_fragment",(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpl,"Return as a final statement in main()",
                 (allocator<char> *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n    o_color = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
                 ,(allocator<char> *)&local_d0);
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar3,pTVar1,(string *)&params,&tmpl.m_template,false,
                 &local_1a0,evalReturnAlways,(UniformSetup *)0x0);
      tcu::TestNode::addChild(local_1a8,pTVar3);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&tmpl);
      std::__cxx11::string::~string((string *)&params);
      iVar2 = 0;
      do {
        if (iVar2 == 2) {
          pcVar9 = (char *)0x0;
          do {
            iVar2 = (int)pcVar9;
            if (iVar2 == 2) {
              pTVar5 = (TestNode *)operator_new(0xe0);
              pTVar1 = local_1a8->m_testCtx;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&params,"return_in_infinite_loop_vertex",
                         (allocator<char> *)&local_118);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&tmpl,"Return in infinite loop",(allocator<char> *)&local_f0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,
                         "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\nlayout(binding = 0, std140) uniform something { int ui_zero; };\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
                         ,(allocator<char> *)&local_d0);
              pRVar7 = (ReturnTestUniformSetup *)operator_new(0x18);
              ReturnTestUniformSetup::ReturnTestUniformSetup(pRVar7,UI_ZERO);
              ShaderReturnCase::ShaderReturnCase
                        ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,true,
                         &local_1a0,evalReturnAlways,(UniformSetup *)pRVar7);
              tcu::TestNode::addChild(local_1a8,pTVar5);
              std::__cxx11::string::~string((string *)&local_1a0);
              std::__cxx11::string::~string((string *)&tmpl);
              std::__cxx11::string::~string((string *)&params);
              pTVar5 = (TestNode *)operator_new(0xe0);
              pTVar1 = local_1a8->m_testCtx;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&params,"return_in_infinite_loop_fragment",
                         (allocator<char> *)&local_118);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&tmpl,"Return in infinite loop",(allocator<char> *)&local_f0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,
                         "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nlayout(binding = 0, std140) uniform something { int ui_zero; };\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    o_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
                         ,(allocator<char> *)&local_d0);
              pRVar7 = (ReturnTestUniformSetup *)operator_new(0x18);
              ReturnTestUniformSetup::ReturnTestUniformSetup(pRVar7,UI_ZERO);
              ShaderReturnCase::ShaderReturnCase
                        ((ShaderReturnCase *)pTVar5,pTVar1,(string *)&params,&tmpl.m_template,false,
                         &local_1a0,evalReturnAlways,(UniformSetup *)pRVar7);
              tcu::TestNode::addChild(local_1a8,pTVar5);
              std::__cxx11::string::~string((string *)&local_1a0);
              std::__cxx11::string::~string((string *)&tmpl);
              iVar2 = std::__cxx11::string::~string((string *)&params);
              return iVar2;
            }
            local_a0 = "dynamic";
            if (iVar2 == 0) {
              local_a0 = "static";
            }
            local_a8 = "ui_one";
            if (iVar2 == 0) {
              local_a8 = "1";
            }
            uVar10 = 0;
            local_b0 = pcVar9;
            while (uVar11 = (uint)uVar10, uVar11 != 3) {
              local_f8 = uVar10;
              iVar2 = 2;
              while( true ) {
                if (iVar2 == 0) break;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_118,"return_in_",(allocator<char> *)&local_f0);
                std::operator+(&local_1a0,&local_118,local_a0);
                std::operator+(&tmpl.m_template,&local_1a0,"_loop_");
                if (uVar11 < 3) {
                  pcVar9 = (&PTR_anon_var_dwarf_7f6c18_00c00060)[local_f8];
                }
                else {
                  pcVar9 = (char *)0x0;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,&tmpl.m_template,pcVar9);
                pcVar9 = "basic_fragment";
                if (iVar2 == 2) {
                  pcVar9 = "basic_vertex";
                }
                std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&params,pcVar9 + 5);
                std::__cxx11::string::~string((string *)&params);
                std::__cxx11::string::~string((string *)&tmpl.m_template);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::~string((string *)&local_118);
                if (uVar11 < 3) {
                  pcVar9 = (&PTR_anon_var_dwarf_89f7d1_00c00078)[local_f8];
                }
                else {
                  pcVar9 = (char *)0x0;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&params,pcVar9,(allocator<char> *)&tmpl.m_template);
                std::operator+(&description,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params," in loop");
                std::__cxx11::string::~string((string *)&params);
                pTVar1 = local_1a8->m_testCtx;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&params,
                           "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\nlayout(binding = 0, std140) uniform something { mediump int ui_one; };\n${EXTRADECL}\n${COORDPREC} vec4 getCoords (void)\n{\n    ${COORDPREC} vec4 coords = ${COORDS};\n    for (int i = 0; i < ${ITERLIMIT}; i++)\n    {\n        if (${RETURNCOND})\n            return coords;\n        coords = coords.wzyx;\n    }\n    return coords;\n}\n\nvoid main (void)\n{\n${POSITIONWRITE}    ${OUTPUT} = vec4(getCoords().xyz, 1.0);\n}\n"
                           ,(allocator<char> *)&local_1a0);
                tcu::StringTemplate::StringTemplate
                          ((StringTemplate *)&tmpl.m_template,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params);
                std::__cxx11::string::~string((string *)&params);
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                pcVar9 = "v_coords";
                if (iVar2 == 2) {
                  pcVar9 = "a_coords";
                }
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &params._M_t._M_impl.super__Rb_tree_header._M_header;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"COORDLOC",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"COORDPREC",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"OUTPUT",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"COORDS",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"EXTRADECL",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"POSITIONWRITE",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"ITERLIMIT",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                std::__cxx11::string::~string((string *)&local_1a0);
                pbVar8 = &local_1a0;
                if (uVar11 == 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1a0,"RETURNCOND",(allocator<char> *)&local_118);
                  pmVar4 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](&params,&local_1a0);
                  std::__cxx11::string::assign((char *)pmVar4);
LAB_005df132:
                  std::__cxx11::string::~string((string *)pbVar8);
                }
                else {
                  if (uVar11 == 1) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1a0,"RETURNCOND",(allocator<char> *)&local_118);
                    pmVar4 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[](&params,&local_1a0);
                    std::__cxx11::string::assign((char *)pmVar4);
                    goto LAB_005df132;
                  }
                  if (uVar11 == 2) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_d0,pcVar9,&local_1a9);
                    std::operator+(&local_f0,&local_d0,".x+");
                    std::operator+(&local_118,&local_f0,pcVar9);
                    std::operator+(&local_1a0,&local_118,".y >= 0.0");
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_50,"RETURNCOND",&local_1aa);
                    pmVar4 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[](&params,&local_50);
                    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1a0);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_1a0);
                    std::__cxx11::string::~string((string *)&local_118);
                    std::__cxx11::string::~string((string *)&local_f0);
                    pbVar8 = &local_d0;
                    goto LAB_005df132;
                  }
                }
                pTVar5 = (TestNode *)operator_new(0xe0);
                tcu::StringTemplate::specialize(&local_1a0,&tmpl,&params);
                if (uVar11 < 3) {
                  p_Var6 = (ShaderEvalFunc)(&PTR_evalReturnAlways_00c00090)[local_f8];
                }
                else {
                  p_Var6 = (ShaderEvalFunc)0x0;
                }
                pRVar7 = (ReturnTestUniformSetup *)operator_new(0x18);
                ReturnTestUniformSetup::ReturnTestUniformSetup(pRVar7,UI_ONE);
                ShaderReturnCase::ShaderReturnCase
                          ((ShaderReturnCase *)pTVar5,pTVar1,&name,&description,iVar2 == 2,
                           &local_1a0,p_Var6,(UniformSetup *)pRVar7);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&params._M_t);
                tcu::StringTemplate::~StringTemplate(&tmpl);
                tcu::TestNode::addChild(local_1a8,pTVar5);
                std::__cxx11::string::~string((string *)&description);
                std::__cxx11::string::~string((string *)&name);
                iVar2 = iVar2 + -1;
              }
              uVar10 = (ulong)(uVar11 + 1);
            }
            pcVar9 = (char *)(ulong)((int)local_b0 + 1);
          } while( true );
        }
        bVar13 = iVar2 == 0;
        local_a0 = "in_func_";
        if (bVar13) {
          local_a0 = "";
        }
        local_a8 = " in user-defined function";
        if (bVar13) {
          local_a8 = " in main()";
        }
        local_b0 = 
        "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\n${EXTRADECL}\nvoid myfunc (void)\n{\n    ${OUTPUT} = vec4(${COORDS}.xyz, 1.0);\n    if (${RETURNCOND})\n        return;\n    ${OUTPUT} = vec4(${COORDS}.wzy, 1.0);\n}\n\nvoid main (void)\n{\n${POSITIONWRITE}    myfunc();\n}\n"
        ;
        if (bVar13) {
          local_b0 = 
          "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\n${EXTRADECL}\nvoid main ()\n{\n${POSITIONWRITE}    ${OUTPUT} = vec4(${COORDS}.xyz, 1.0);\n    if (${RETURNCOND})\n        return;\n    ${OUTPUT} = vec4(${COORDS}.wzy, 1.0);\n}\n"
          ;
        }
        for (uVar11 = 0; uVar11 != 3; uVar11 = uVar11 + 1) {
          local_f8 = (ulong)uVar11;
          iVar12 = 2;
          while( true ) {
            if (iVar12 == 0) break;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"output_write_",(allocator<char> *)&local_118);
            std::operator+(&tmpl.m_template,&local_1a0,local_a0);
            if (uVar11 < 3) {
              pcVar9 = (&PTR_anon_var_dwarf_7f6c18_00c00060)[local_f8];
            }
            else {
              pcVar9 = (char *)0x0;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&tmpl.m_template,pcVar9);
            pcVar9 = "basic_fragment";
            if (iVar12 == 2) {
              pcVar9 = "basic_vertex";
            }
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,pcVar9 + 5);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&tmpl.m_template);
            std::__cxx11::string::~string((string *)&local_1a0);
            if (uVar11 < 3) {
              pcVar9 = (&PTR_anon_var_dwarf_89f7d1_00c00078)[local_f8];
            }
            else {
              pcVar9 = (char *)0x0;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tmpl.m_template,pcVar9,(allocator<char> *)&local_1a0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&tmpl.m_template,local_a8);
            std::operator+(&description,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params," between output writes");
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&tmpl.m_template);
            pTVar1 = local_1a8->m_testCtx;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,local_b0,(allocator<char> *)&local_1a0);
            tcu::StringTemplate::StringTemplate
                      ((StringTemplate *)&tmpl.m_template,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params)
            ;
            std::__cxx11::string::~string((string *)&params);
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pcVar9 = "v_coords";
            if (iVar12 == 2) {
              pcVar9 = "a_coords";
            }
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"COORDLOC",(allocator<char> *)&local_118);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_1a0);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"COORDPREC",(allocator<char> *)&local_118);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_1a0);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"COORDS",(allocator<char> *)&local_118);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_1a0);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"OUTPUT",(allocator<char> *)&local_118);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_1a0);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"EXTRADECL",(allocator<char> *)&local_118);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_1a0);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"POSITIONWRITE",(allocator<char> *)&local_118);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&params,&local_1a0);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&local_1a0);
            pbVar8 = &local_1a0;
            if (uVar11 == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,"RETURNCOND",(allocator<char> *)&local_118);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&params,&local_1a0);
              std::__cxx11::string::assign((char *)pmVar4);
LAB_005deb49:
              std::__cxx11::string::~string((string *)pbVar8);
            }
            else {
              if (uVar11 == 1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"RETURNCOND",(allocator<char> *)&local_118);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_1a0);
                std::__cxx11::string::assign((char *)pmVar4);
                goto LAB_005deb49;
              }
              if (uVar11 == 2) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_d0,pcVar9,&local_1a9);
                std::operator+(&local_f0,&local_d0,".x+");
                std::operator+(&local_118,&local_f0,pcVar9);
                std::operator+(&local_1a0,&local_118,".y >= 0.0");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,"RETURNCOND",&local_1aa);
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&params,&local_50);
                std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1a0);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::~string((string *)&local_118);
                std::__cxx11::string::~string((string *)&local_f0);
                pbVar8 = &local_d0;
                goto LAB_005deb49;
              }
            }
            pTVar5 = (TestNode *)operator_new(0xe0);
            tcu::StringTemplate::specialize(&local_1a0,&tmpl,&params);
            if (uVar11 < 3) {
              p_Var6 = (ShaderEvalFunc)(&PTR_evalReturnAlways_00c00090)[local_f8];
            }
            else {
              p_Var6 = (ShaderEvalFunc)0x0;
            }
            ShaderReturnCase::ShaderReturnCase
                      ((ShaderReturnCase *)pTVar5,pTVar1,&name,&description,iVar12 == 2,&local_1a0,
                       p_Var6,(UniformSetup *)0x0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&params);
            tcu::StringTemplate::~StringTemplate(&tmpl);
            tcu::TestNode::addChild(local_1a8,pTVar5);
            std::__cxx11::string::~string((string *)&description);
            std::__cxx11::string::~string((string *)&name);
            iVar12 = iVar12 + -1;
          }
        }
        iVar2 = iVar2 + 1;
      } while( true );
    }
    iVar2 = 2;
    while( true ) {
      if (iVar2 == 0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmpl.m_template,"conditional_return_",(allocator<char> *)&local_1a0);
      if (uVar11 < 3) {
        pcVar9 = (&PTR_anon_var_dwarf_7f6c18_00c00060)[uVar11];
      }
      else {
        pcVar9 = (char *)0x0;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     &tmpl.m_template,pcVar9);
      pcVar9 = "basic_fragment";
      if (iVar2 == 2) {
        pcVar9 = "basic_vertex";
      }
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,pcVar9 + 5);
      std::__cxx11::string::~string((string *)&params);
      std::__cxx11::string::~string((string *)&tmpl.m_template);
      if (uVar11 < 3) {
        pcVar9 = (&PTR_anon_var_dwarf_89f7d1_00c00078)[uVar11];
      }
      else {
        pcVar9 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar9,(allocator<char> *)&tmpl.m_template);
      std::operator+(&description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     " in function");
      std::__cxx11::string::~string((string *)&params);
      pTVar1 = local_1a8->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,
                 "#version 310 es\nlayout(location = ${COORDLOC}) in ${COORDPREC} vec4 ${COORDS};\n${EXTRADECL}\n${COORDPREC} vec4 getColor (void)\n{\n    if (${RETURNCOND})\n        return vec4(${COORDS}.xyz, 1.0);\n    return vec4(${COORDS}.wzy, 1.0);\n}\n\nvoid main (void)\n{\n${POSITIONWRITE}    ${OUTPUT} = getColor();\n}\n"
                 ,(allocator<char> *)&local_1a0);
      tcu::StringTemplate::StringTemplate
                ((StringTemplate *)&tmpl.m_template,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
      std::__cxx11::string::~string((string *)&params);
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar9 = "v_coords";
      if (iVar2 == 2) {
        pcVar9 = "a_coords";
      }
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"COORDLOC",(allocator<char> *)&local_118);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_1a0);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"COORDPREC",(allocator<char> *)&local_118);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_1a0);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"OUTPUT",(allocator<char> *)&local_118);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_1a0);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"COORDS",(allocator<char> *)&local_118);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_1a0);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"EXTRADECL",(allocator<char> *)&local_118);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_1a0);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"POSITIONWRITE",(allocator<char> *)&local_118);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&local_1a0);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      pbVar8 = &local_1a0;
      if (uVar11 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,"RETURNCOND",(allocator<char> *)&local_118);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_1a0);
        std::__cxx11::string::assign((char *)pmVar4);
LAB_005de285:
        std::__cxx11::string::~string((string *)pbVar8);
      }
      else {
        if (uVar11 == 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"RETURNCOND",(allocator<char> *)&local_118);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&params,&local_1a0);
          std::__cxx11::string::assign((char *)pmVar4);
          goto LAB_005de285;
        }
        if (uVar11 == 2) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar9,&local_1a9);
          std::operator+(&local_f0,&local_d0,".x+");
          std::operator+(&local_118,&local_f0,pcVar9);
          std::operator+(&local_1a0,&local_118,".y >= 0.0");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"RETURNCOND",&local_1aa);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&params,&local_50);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f0);
          pbVar8 = &local_d0;
          goto LAB_005de285;
        }
      }
      pTVar5 = (TestNode *)operator_new(0xe0);
      tcu::StringTemplate::specialize(&local_1a0,&tmpl,&params);
      if (uVar11 < 3) {
        p_Var6 = (ShaderEvalFunc)(&PTR_evalReturnAlways_00c00090)[uVar11];
      }
      else {
        p_Var6 = (ShaderEvalFunc)0x0;
      }
      ShaderReturnCase::ShaderReturnCase
                ((ShaderReturnCase *)pTVar5,pTVar1,&name,&description,iVar2 == 2,&local_1a0,p_Var6,
                 (UniformSetup *)0x0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      tcu::StringTemplate::~StringTemplate(&tmpl);
      tcu::TestNode::addChild(local_1a8,pTVar5);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&name);
      iVar2 = iVar2 + -1;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void ShaderReturnTests::init (void)
{
	addChild(new ShaderReturnCase(m_testCtx, "single_return_vertex", "Single return statement in function", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "single_return_fragment", "Single return statement in function", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			std::string						name		= std::string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			std::string						description	= std::string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			de::MovePtr<ShaderReturnCase>	testCase	(makeConditionalReturnInFuncCase(m_testCtx, name, description, (ReturnMode)returnMode, isFragment == 0));
			addChild(testCase.release());
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_testCtx, "double_return_vertex", "Unconditional double return in function", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "double_return_fragment", "Unconditional double return in function", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_testCtx, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				std::string						name		= std::string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				std::string						desc		= std::string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";
				de::MovePtr<ShaderReturnCase>	testCase	= (makeOutputWriteReturnCase(m_testCtx, name, desc, inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
				addChild(testCase.release());
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				std::string						name		= std::string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				std::string						description	= std::string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				de::MovePtr<ShaderReturnCase>	testCase	(makeReturnInLoopCase(m_testCtx, name, description, isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
				addChild(testCase.release());
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_testCtx, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n"
		"layout(binding = 0, std140) uniform something { int ui_zero; };\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, new ReturnTestUniformSetup(UI_ZERO)));
	addChild(new ShaderReturnCase(m_testCtx, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"layout(binding = 0, std140) uniform something { int ui_zero; };\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, new ReturnTestUniformSetup(UI_ZERO)));
}